

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  undefined8 *puVar1;
  uintptr_t *puVar2;
  _Any_data *__dest;
  MixedArena **__rhs;
  undefined8 this_00;
  HeapTypeKind HVar3;
  size_t size;
  Resume *expr;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *sentTypes;
  char *pcVar4;
  MixedArena **handlerBlocks;
  char *pcVar5;
  Type *pTVar6;
  optional<wasm::HeapType> ct_00;
  undefined1 local_1b8 [8];
  Signature contSig;
  Resume curr;
  Result<wasm::ResumeTable> resumetable;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  undefined1 local_98 [8];
  Result<wasm::ResumeTable> _val;
  ChildPopper local_58;
  undefined8 local_50;
  Module *local_48;
  Function *pFStack_40;
  _Storage<wasm::HeapType,_true> local_38;
  HeapType ct_local;
  
  local_38 = (_Storage<wasm::HeapType,_true>)ct.id;
  if ((long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(tags->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(labels->
            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    HVar3 = HeapType::getKind((HeapType *)&stack0xffffffffffffffc8);
    if (HVar3 == Cont) {
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements
           = (size_t)&this->wasm->allocator;
      contSig.results.id._0_1_ = 0x5d;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._id = InvalidId;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._1_7_ = 0;
      curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id = 0;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0
      ;
      curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
      curr.handlerTags.allocator = (MixedArena *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)0x0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0
      ;
      curr.handlerBlocks.allocator = (MixedArena *)0x0;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
           = (Expression **)0x0;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      curr.cont = (Expression *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
      curr.handlerBlocks.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      curr.sentTypes.super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements =
           curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           allocatedElements;
      _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this;
      curr.sentTypes.allocator =
           (MixedArena *)HeapType::getContinuation((HeapType *)&stack0xffffffffffffffc8);
      _local_1b8 = HeapType::getSignature((HeapType *)&curr.sentTypes.allocator);
      size = wasm::Type::size((Type *)local_1b8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 &curr.handlerBlocks.allocator,size);
      this_00 = _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_index =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_index;
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._49_7_ =
           _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
           super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
           super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
           super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._49_7_;
      local_b8._8_8_ = 0;
      local_b8._M_unused._M_object =
           (void *)_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                   super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_;
      local_a0 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<wasm::Result<wasm::Type>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2433:5)>
                 ::_M_manager;
      makeResumeTable((Result<wasm::ResumeTable> *)&curr.sentTypes.allocator,labels,
                      (function<wasm::Result<wasm::Name>_(unsigned_int)> *)
                      ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30),
                      (function<wasm::Result<wasm::Type>_(unsigned_int)> *)&local_b8);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      __dest = (_Any_data *)
               ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                       super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30);
      std::
      _Function_handler<wasm::Result<wasm::Name>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp:2432:5)>
      ::_M_manager(__dest,__dest,__destroy_functor);
      __rhs = &curr.sentTypes.allocator;
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)local_98,
                      (_Copy_ctor_base<false,_wasm::ResumeTable,_wasm::Err> *)__rhs);
      if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
          super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
          super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
          super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[0x28] == '\x01') {
        local_58.builder = (IRBuilder *)&stack0xffffffffffffffb8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_98,
                   _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                   super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                   super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                   (long)local_98);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_58.builder == (IRBuilder *)&stack0xffffffffffffffb8) {
          *puVar1 = local_48;
          *(Function **)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = pFStack_40;
        }
        else {
          *(IRBuilder **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.builder;
          *(Module **)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_48;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_50;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)local_98);
        local_58.builder = (IRBuilder *)this_00;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)local_38;
        ChildPopper::visitResume
                  ((Result<wasm::Ok> *)local_98,&local_58,(Resume *)&contSig.results,ct_00);
        if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
            super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
            super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
            super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
            _M_storage[0x18] == '\x01') {
          local_58.builder = (IRBuilder *)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_98,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_98);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
          anon_unknown_283::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_98,local_38._M_value.id,
                     (Expression *)curr.operands.allocator);
          if (_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
              super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
              super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
              super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
              _M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
            handlerBlocks = (MixedArena **)0x0;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              handlerBlocks = __rhs;
            }
            sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x18;
            if (resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._M_first._M_storage.
                _M_storage[0x28] == '\0') {
              sentTypes = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                          ((long)&resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x10);
            }
            expr = Builder::makeResume((Builder *)(this_00 + 0x10),tags,
                                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                       handlerBlocks,sentTypes,
                                       (ExpressionList *)&curr.handlerBlocks.allocator,
                                       (Expression *)curr.operands.allocator);
            push((IRBuilder *)this_00,(Expression *)expr);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
            goto LAB_00c8e81b;
          }
          local_58.builder = (IRBuilder *)&stack0xffffffffffffffb8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_98,
                     _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                     super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                     super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._M_u._0_8_ +
                     (long)local_98);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_58.builder == (IRBuilder *)&stack0xffffffffffffffb8) {
          *puVar1 = local_48;
          *(Function **)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = pFStack_40;
        }
        else {
          *(IRBuilder **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.builder;
          *(Module **)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_48;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_50;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_98);
      }
LAB_00c8e81b:
      std::__detail::__variant::_Variant_storage<false,_wasm::ResumeTable,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::ResumeTable,_wasm::Err> *)
                        &curr.sentTypes.allocator);
      return __return_storage_ptr__;
    }
    pcVar5 = "expected continuation type";
    pcVar4 = "";
  }
  else {
    pcVar5 = "the sizes of tags and labels must be equal";
    pcVar4 = "";
  }
  pTVar6 = &curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type;
  contSig.results.id = (uintptr_t)pTVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&contSig.results,pcVar5,pcVar4);
  puVar2 = (uintptr_t *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(uintptr_t **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
  if ((Type *)contSig.results.id == pTVar6) {
    *puVar2 = curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id;
    *(Name **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
         curr.handlerTags.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
  }
  else {
    *(uintptr_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = contSig.results.id;
    *(uintptr_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
         curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression.type.id;
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
       curr.super_SpecificExpression<(wasm::Expression::Id)93>.super_Expression._0_8_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResume(HeapType ct,
                      const std::vector<Name>& tags,
                      const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  Resume curr(wasm.allocator);
  auto contSig = ct.getContinuation().type.getSignature();
  curr.operands.resize(contSig.params.size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResume(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResume(tags,
                          resumetable->targets,
                          resumetable->sentTypes,
                          std::move(curr.operands),
                          curr.cont));

  return Ok{};
}